

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  vec3f light_dir_00;
  allocator<char> local_1c9;
  string local_1c8;
  double local_1a8;
  double dStack_1a0;
  double local_198;
  undefined1 auStack_190 [8];
  vec3f light_dir;
  TGAImage image;
  allocator<char> local_139;
  string local_138;
  undefined1 local_118 [8];
  Model model;
  
  model.specularmap_._36_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"obj/african_head.obj",&local_139);
  Model::Model((Model *)local_118,&local_138,true,false,false);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  TGAImage::TGAImage((TGAImage *)&light_dir.z,600,600,3);
  vec<3UL,_double>::vec((vec<3UL,_double> *)auStack_190,0.0,0.0,-1.0);
  local_198 = light_dir.y;
  local_1a8 = (double)auStack_190;
  dStack_1a0 = light_dir.x;
  light_dir_00.y = light_dir.x;
  light_dir_00.x = (double)auStack_190;
  light_dir_00.z = light_dir.y;
  lambert_textured_lighting(light_dir_00,(Model *)local_118,(TGAImage *)&light_dir.z);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"output.tga",&local_1c9);
  TGAImage::write_tga_file((TGAImage *)&light_dir.z,&local_1c8,true,true);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  model.specularmap_._36_4_ = 0;
  TGAImage::~TGAImage((TGAImage *)&light_dir.z);
  Model::~Model((Model *)local_118);
  return model.specularmap_._36_4_;
}

Assistant:

int main()
{
    Model model{"obj/african_head.obj", true, false, false};
    TGAImage image(width, height, TGAImage::RGB);
    vec3f light_dir{0, 0, -1};
    // lambert_lighting(light_dir, model, image);
    // random_colors(model, image);
    lambert_textured_lighting(light_dir, model, image);
    image.write_tga_file("output.tga");
    return 0;
}